

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:286:66)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:286:66)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  long *plVar1;
  undefined8 *puVar2;
  object_ptr o;
  gc_heap_ptr_untyped gStack_a8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_98;
  value local_78;
  value local_50;
  undefined8 local_28;
  wchar_t *local_20;
  
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar1 + 0x88))(&gStack_a8,plVar1,this_);
  puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&gStack_a8);
  local_28 = 8;
  local_20 = L"toString";
  (**(code **)*puVar2)(&local_50,puVar2);
  value::value(&local_78,(object_ptr *)&gStack_a8);
  local_98.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  call_function(__return_storage_ptr__,&local_50,&local_78,&local_98);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_98);
  value::~value(&local_78);
  value::~value(&local_50);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_a8);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }